

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopEncoderLog(Mem_Flex_t *pMan,int iBit,int nValues)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Vec_Str_t *p;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  int i_1;
  int i;
  long lVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  
  uVar10 = nValues - 1;
  uVar21 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar21 == 0; uVar21 = uVar21 - 1) {
    }
  }
  iVar6 = (uVar21 ^ 0xffffffe0) + 0x21;
  if ((uint)nValues < 2) {
    iVar6 = nValues;
  }
  if (iBit < iVar6) {
    iVar6 = 0;
    if (nValues < 1) {
      bVar12 = false;
    }
    else {
      uVar7 = nValues + 3U & 0xfffffffc;
      uVar21 = 0;
      uVar22 = 1;
      uVar23 = 2;
      uVar5 = 3;
      uVar14 = 0;
      uVar16 = 0;
      uVar18 = 0;
      uVar20 = 0;
      do {
        uVar19 = uVar20;
        uVar17 = uVar18;
        uVar15 = uVar16;
        uVar13 = uVar14;
        uVar27 = uVar5;
        uVar26 = uVar23;
        uVar25 = uVar22;
        uVar24 = uVar21;
        uVar2 = (ulong)(uint)iBit;
        uVar14 = (uVar24 >> uVar2 & 1) + uVar13;
        uVar16 = (uVar25 >> uVar2 & 1) + uVar15;
        uVar18 = (uVar26 >> uVar2 & 1) + uVar17;
        uVar20 = (uVar27 >> uVar2 & 1) + uVar19;
        uVar7 = uVar7 - 4;
        uVar21 = uVar24 + 4;
        uVar22 = uVar25 + 4;
        uVar23 = uVar26 + 4;
        uVar5 = uVar27 + 4;
      } while (uVar7 != 0);
      uVar21 = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar24 ^ 0x80000000));
      uVar22 = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar25 ^ 0x80000000));
      uVar23 = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
      uVar10 = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar27 ^ 0x80000000));
      bVar12 = 1 < (~uVar10 & uVar20 | uVar19 & uVar10) + (~uVar22 & uVar16 | uVar15 & uVar22) +
                   (~uVar23 & uVar18 | uVar17 & uVar23) + (~uVar21 & uVar14 | uVar13 & uVar21);
    }
    p = (Vec_Str_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    pcVar8 = (char *)malloc(100);
    p->pArray = pcVar8;
    lVar11 = 0;
    while( true ) {
      cVar1 = "d0\n"[lVar11];
      if (iVar6 == p->nCap) {
        if (iVar6 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          uVar21 = iVar6 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc((ulong)uVar21);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,(ulong)uVar21);
          }
          p->pArray = pcVar8;
          p->nCap = uVar21;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      p->nSize = iVar6 + 1;
      pcVar8[iVar6] = cVar1;
      if (lVar11 == 2) break;
      iVar6 = p->nSize;
      lVar11 = lVar11 + 1;
    }
    if (bVar12) {
      uVar21 = p->nSize;
      if (uVar21 == p->nCap) {
        if ((int)uVar21 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar21 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar3);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar3);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar3;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      p->nSize = uVar21 + 1;
      pcVar8[(int)uVar21] = '(';
    }
    if (0 < nValues) {
      bVar4 = true;
      uVar21 = 0;
      do {
        if ((uVar21 & 1 << ((byte)iBit & 0x1f)) != 0) {
          if (!bVar4) {
            uVar10 = p->nSize;
            if (uVar10 == p->nCap) {
              if ((int)uVar10 < 0x10) {
                if (p->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(p->pArray,0x10);
                }
                p->pArray = pcVar8;
                p->nCap = 0x10;
              }
              else {
                sVar3 = (ulong)uVar10 * 2;
                if (p->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar3);
                }
                else {
                  pcVar8 = (char *)realloc(p->pArray,sVar3);
                }
                p->pArray = pcVar8;
                p->nCap = (int)sVar3;
              }
            }
            else {
              pcVar8 = p->pArray;
            }
            p->nSize = uVar10 + 1;
            pcVar8[(int)uVar10] = ',';
          }
          Vec_StrPrintNum(p,uVar21);
          bVar4 = false;
        }
        uVar21 = uVar21 + 1;
      } while (nValues != uVar21);
    }
    if (bVar12) {
      uVar21 = p->nSize;
      if (uVar21 == p->nCap) {
        if ((int)uVar21 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar21 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar3);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar3);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar3;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      p->nSize = uVar21 + 1;
      pcVar8[(int)uVar21] = ')';
    }
    lVar11 = 0;
    do {
      cVar1 = ".names n%0*d\n 1\n"[lVar11 + 0xd];
      uVar21 = p->nSize;
      if (uVar21 == p->nCap) {
        if ((int)uVar21 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(0x10);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar8;
          p->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar21 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar8 = (char *)malloc(sVar3);
          }
          else {
            pcVar8 = (char *)realloc(p->pArray,sVar3);
          }
          p->pArray = pcVar8;
          p->nCap = (int)sVar3;
        }
      }
      else {
        pcVar8 = p->pArray;
      }
      p->nSize = uVar21 + 1;
      pcVar8[(int)uVar21] = cVar1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    uVar21 = p->nSize;
    if (uVar21 == p->nCap) {
      if ((int)uVar21 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar8;
        p->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar21 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar3);
        }
        else {
          pcVar8 = (char *)realloc(p->pArray,sVar3);
        }
        p->pArray = pcVar8;
        p->nCap = (int)sVar3;
      }
    }
    else {
      pcVar8 = p->pArray;
    }
    p->nSize = uVar21 + 1;
    pcVar8[(int)uVar21] = '\0';
    pcVar8 = p->pArray;
    pcVar9 = Abc_SopRegister(pMan,pcVar8);
    if (pcVar8 != (char *)0x0) {
      free(pcVar8);
    }
    free(p);
    return pcVar9;
  }
  __assert_fail("iBit < nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                ,0x449,"char *Abc_SopEncoderLog(Mem_Flex_t *, int, int)");
}

Assistant:

char * Abc_SopEncoderLog( Mem_Flex_t * pMan, int iBit, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int v, Counter, fFirst = 1, nBits = Abc_Base2Log(nValues);
    assert( iBit < nBits );
    // count the number of literals
    Counter = 0;
    for ( v = 0; v < nValues; v++ )
        Counter += ( (v & (1 << iBit)) > 0 );
    // create the cover
    vSop = Vec_StrAlloc( 100 );
    Vec_StrPrintStr( vSop, "d0\n" );
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, "(" );
    for ( v = 0; v < nValues; v++ )
        if ( v & (1 << iBit) )
        {
            if ( fFirst )
                fFirst = 0;
            else
                Vec_StrPush( vSop, ',' );
            Vec_StrPrintNum( vSop, v );
        }
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, ")" );
    Vec_StrPrintStr( vSop, " 1\n" );
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}